

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

PClassActor * __thiscall PClassActor::GetReplacement(PClassActor *this,bool lookskill)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  FSkillInfo *pFVar5;
  PClass *pPVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  FName local_54;
  PClassActor *local_50;
  PClassActor *rep;
  PClassActor *savedrep;
  FName local_38;
  FName local_34;
  FName local_30;
  FName local_2c;
  FName local_28;
  undefined1 local_24 [11];
  byte local_19;
  FName skillrepname;
  bool lookskill_local;
  PClassActor *this_local;
  
  local_19 = lookskill;
  _skillrepname = this;
  FName::FName((FName *)(local_24 + 4));
  if ((local_19 & 1) != 0) {
    uVar2 = TArray<FSkillInfo,_FSkillInfo>::Size(&AllSkills);
    uVar3 = FIntCVar::operator_cast_to_int(&gameskill);
    if (uVar3 < uVar2) {
      iVar4 = FIntCVar::operator_cast_to_int(&gameskill);
      pFVar5 = TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(long)iVar4);
      FName::FName(&local_28,&(this->super_PClass).super_PStruct.super_PNamedType.TypeName);
      FSkillInfo::GetReplacement((FSkillInfo *)local_24,&pFVar5->Name);
      FName::operator=((FName *)(local_24 + 4),(FName *)local_24);
      bVar1 = FName::operator!=((FName *)(local_24 + 4),NAME_None);
      if (bVar1) {
        FName::FName(&local_2c,(FName *)(local_24 + 4));
        pPVar6 = PClass::FindClass(&local_2c);
        if (pPVar6 == (PClass *)0x0) {
          iVar4 = FIntCVar::operator_cast_to_int(&gameskill);
          pFVar5 = TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(long)iVar4);
          pcVar7 = FName::GetChars(&pFVar5->Name);
          pcVar8 = FName::GetChars(&(this->super_PClass).super_PStruct.super_PNamedType.TypeName);
          pcVar9 = FName::GetChars((FName *)(local_24 + 4));
          Printf("Warning: incorrect actor name in definition of skill %s: \nclass %s is replaced by non-existent class %s\nSkill replacement will be ignored for this actor.\n"
                 ,pcVar7,pcVar8,pcVar9);
          iVar4 = FIntCVar::operator_cast_to_int(&gameskill);
          pFVar5 = TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(long)iVar4);
          FName::FName(&local_30,&(this->super_PClass).super_PStruct.super_PNamedType.TypeName);
          FName::FName(&local_34,NAME_None);
          FSkillInfo::SetReplacement(pFVar5,&local_30,&local_34);
          iVar4 = FIntCVar::operator_cast_to_int(&gameskill);
          pFVar5 = TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(long)iVar4);
          FName::FName(&local_38,(FName *)(local_24 + 4));
          FName::FName((FName *)((long)&savedrep + 4),NAME_None);
          FSkillInfo::SetReplacedBy(pFVar5,&local_38,(FName *)((long)&savedrep + 4));
          local_19 = 0;
          FName::operator=((FName *)(local_24 + 4),NAME_None);
        }
      }
    }
  }
  if ((this->Replacement != (PClassActor *)0x0) ||
     ((this_local = this, (local_19 & 1) != 0 &&
      (bVar1 = FName::operator==((FName *)(local_24 + 4),NAME_None), !bVar1)))) {
    local_50 = this->Replacement;
    this->Replacement = (PClassActor *)0x0;
    rep = local_50;
    if (((local_19 & 1) != 0) &&
       (bVar1 = FName::operator!=((FName *)(local_24 + 4),NAME_None), bVar1)) {
      FName::FName(&local_54,(FName *)(local_24 + 4));
      local_50 = PClass::FindActor(&local_54);
    }
    this_local = GetReplacement(local_50,false);
    this->Replacement = rep;
  }
  return this_local;
}

Assistant:

PClassActor *PClassActor::GetReplacement(bool lookskill)
{
	FName skillrepname;
	
	if (lookskill && AllSkills.Size() > (unsigned)gameskill)
	{
		skillrepname = AllSkills[gameskill].GetReplacement(TypeName);
		if (skillrepname != NAME_None && PClass::FindClass(skillrepname) == NULL)
		{
			Printf("Warning: incorrect actor name in definition of skill %s: \n"
				   "class %s is replaced by non-existent class %s\n"
				   "Skill replacement will be ignored for this actor.\n", 
				   AllSkills[gameskill].Name.GetChars(), 
				   TypeName.GetChars(), skillrepname.GetChars());
			AllSkills[gameskill].SetReplacement(TypeName, NAME_None);
			AllSkills[gameskill].SetReplacedBy(skillrepname, NAME_None);
			lookskill = false; skillrepname = NAME_None;
		}
	}
	if (Replacement == NULL && (!lookskill || skillrepname == NAME_None))
	{
		return this;
	}
	// The Replacement field is temporarily NULLed to prevent
	// potential infinite recursion.
	PClassActor *savedrep = Replacement;
	Replacement = NULL;
	PClassActor *rep = savedrep;
	// Handle skill-based replacement here. It has precedence on DECORATE replacement
	// in that the skill replacement is applied first, followed by DECORATE replacement
	// on the actor indicated by the skill replacement.
	if (lookskill && (skillrepname != NAME_None))
	{
		rep = PClass::FindActor(skillrepname);
	}
	// Now handle DECORATE replacement chain
	// Skill replacements are not recursive, contrarily to DECORATE replacements
	rep = rep->GetReplacement(false);
	// Reset the temporarily NULLed field
	Replacement = savedrep;
	return rep;
}